

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseRegisterCommand(WastParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  Result RVar2;
  Command *pCVar3;
  Enum EVar4;
  string text;
  Location loc;
  Var var;
  string local_f8;
  Location local_d8;
  Var local_b8;
  Var local_70;
  
  RVar2 = Expect(this,Lpar);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    GetToken((Token *)&local_b8,this);
    local_d8.field_1.field_1.offset = local_b8.loc.field_1.field_1.offset;
    local_d8.field_1._8_8_ = local_b8.loc.field_1._8_8_;
    local_d8.filename._M_len = local_b8.loc.filename._M_len;
    local_d8.filename._M_str = local_b8.loc.filename._M_str;
    RVar2 = Expect(this,Register);
    EVar4 = Error;
    if (RVar2.enum_ != Error) {
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      Var::Var(&local_b8);
      RVar2 = ParseQuotedText(this,&local_f8,true);
      EVar4 = Error;
      if (RVar2.enum_ != Error) {
        Var::Var(&local_70,this->last_module_index_,&local_d8);
        ParseVarOpt(this,&local_b8,&local_70);
        Var::~Var(&local_70);
        RVar2 = Expect(this,Rpar);
        if (RVar2.enum_ != Error) {
          pCVar3 = (Command *)operator_new(0x78);
          pCVar3->type = Register;
          pCVar3->_vptr_Command = (_func_int **)&PTR__RegisterCommand_002414d8;
          pCVar3[1]._vptr_Command = (_func_int **)(pCVar3 + 2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(pCVar3 + 1),local_f8._M_dataplus._M_p,
                     local_f8._M_dataplus._M_p + local_f8._M_string_length);
          Var::Var((Var *)(pCVar3 + 3),&local_b8);
          pCVar1 = (out_command->_M_t).
                   super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                   super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                   super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
          (out_command->_M_t).
          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
          super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar3;
          EVar4 = Ok;
          if (pCVar1 != (Command *)0x0) {
            (*pCVar1->_vptr_Command[1])();
            EVar4 = Ok;
          }
        }
      }
      Var::~Var(&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseRegisterCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseRegisterCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Register);
  std::string text;
  Var var;
  CHECK_RESULT(ParseQuotedText(&text));
  ParseVarOpt(&var, Var(last_module_index_, loc));
  EXPECT(Rpar);
  out_command->reset(new RegisterCommand(text, var));
  return Result::Ok;
}